

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int DisconnectSBGx(SBG *pSBG)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if ((SBG *)addrsSBG[lVar2] == pSBG) {
      iVar1 = DisconnectSBG(pSBG);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsSBG[lVar2] = (void *)0x0;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int DisconnectSBGx(SBG* pSBG)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsSBG[id] != pSBG)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = DisconnectSBG(pSBG);
	if (res != EXIT_SUCCESS) return res;

	addrsSBG[id] = NULL;

	return EXIT_SUCCESS;
}